

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

void __thiscall QAbstractProxyModel::QAbstractProxyModel(QAbstractProxyModel *this,QObject *parent)

{
  QAbstractItemModelPrivate *dd;
  QAbstractItemModel *pQVar1;
  QObject *in_RDI;
  QAbstractProxyModelPrivate *in_stack_ffffffffffffffe0;
  
  dd = (QAbstractItemModelPrivate *)operator_new(0xe8);
  QAbstractProxyModelPrivate::QAbstractProxyModelPrivate(in_stack_ffffffffffffffe0);
  QAbstractItemModel::QAbstractItemModel((QAbstractItemModel *)in_stack_ffffffffffffffe0,dd,in_RDI);
  in_RDI->_vptr_QObject = (_func_int **)&PTR_metaObject_00bed860;
  pQVar1 = QAbstractItemModelPrivate::staticEmptyModel();
  (*in_RDI->_vptr_QObject[0x31])(in_RDI,pQVar1);
  return;
}

Assistant:

QAbstractProxyModel::QAbstractProxyModel(QObject *parent)
    :QAbstractItemModel(*new QAbstractProxyModelPrivate, parent)
{
    setSourceModel(QAbstractItemModelPrivate::staticEmptyModel());
}